

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_granularity.c
# Opt level: O0

void * alloc_checked(mempool *pool,uint pos)

{
  uint *puVar1;
  uint pos_local;
  mempool *pool_local;
  
  if (ptrs[pos] != (uint *)0x0) {
    fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","ptrs[pos] == NULL",
            "false",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_granularity.c"
            ,0x28,"alloc_checked");
    exit(-1);
  }
  puVar1 = (uint *)mempool_alloc(pool);
  ptrs[pos] = puVar1;
  if (ptrs[pos] == (uint *)0x0) {
    fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","ptrs[pos] != NULL",
            "false",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_granularity.c"
            ,0x2a,"alloc_checked");
    exit(-1);
  }
  *ptrs[pos] = pos;
  ptrs[pos][(ulong)(pool->objsize >> 2) - 1] = pos;
  return ptrs[pos];
}

Assistant:

static inline void *
alloc_checked(struct mempool *pool, unsigned pos)
{
	fail_unless(ptrs[pos] == NULL);
	ptrs[pos] = mempool_alloc(pool);
	fail_unless(ptrs[pos] != NULL);
	/*
	 * Saving some data for test purposes
	 */
	ptrs[pos][0] = pos;
	ptrs[pos][pool->objsize/sizeof(unsigned)-1] = pos;
	return ptrs[pos];
}